

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

void Abc_NodeSuperChoiceCollect(Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  void *pvVar1;
  int i;
  int iVar2;
  int iVar3;
  
  iVar3 = vLeaves->nSize;
  iVar2 = iVar3;
  for (i = 0; i < iVar2; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vLeaves,i);
    *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x60;
    iVar2 = vLeaves->nSize;
  }
  vVolume->nSize = 0;
  vLeaves->nSize = 0;
  Abc_NodeSuperChoiceCollect_rec(pRoot,vLeaves,vVolume);
  if (vLeaves->nSize == iVar3) {
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(vLeaves,iVar2);
      *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xbf;
      iVar3 = vLeaves->nSize;
    }
    for (iVar3 = 0; iVar3 < vVolume->nSize; iVar3 = iVar3 + 1) {
      pvVar1 = Vec_PtrEntry(vVolume,iVar3);
      *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xbf;
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vLeaves) == nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                ,0x1db,"void Abc_NodeSuperChoiceCollect(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NodeSuperChoiceCollect( Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    Abc_Obj_t * pObj;
    int i, nLeaves;
    nLeaves = Vec_PtrSize(vLeaves);
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkB = pObj->fMarkC = 1;
    Vec_PtrClear( vVolume );
    Vec_PtrClear( vLeaves );
    Abc_NodeSuperChoiceCollect_rec( pRoot, vLeaves, vVolume );
    assert( Vec_PtrSize(vLeaves) == nLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vVolume, pObj, i )
        pObj->fMarkC = 0;
}